

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O1

void printFlagBitsJSON(uint32_t indent,char *nl,uint32_t flags,
                      _func_char_ptr_uint32_t__Bool *toStringFn)

{
  bool bVar1;
  char *pcVar2;
  uint8_t *puVar3;
  char *pcVar4;
  uint uVar5;
  uint32_t bit_index;
  uint bit_index_00;
  
  bit_index_00 = 0;
  bVar1 = true;
  do {
    uVar5 = 1 << ((byte)bit_index_00 & 0x1f);
    pcVar2 = ktxBUImageFlagsBitString(bit_index_00,(flags >> (bit_index_00 & 0x1f) & 1) != 0);
    if (pcVar2 == (char *)0x0) {
      if ((uVar5 & flags) != 0) {
        pcVar2 = ",";
        puVar3 = (uint8_t *)nl;
        if (bVar1) {
          pcVar2 = "";
          puVar3 = "";
        }
        bVar1 = false;
        printf("%s%s%*s%u",pcVar2,puVar3,(ulong)indent,"",(ulong)uVar5);
      }
    }
    else {
      pcVar4 = ",";
      puVar3 = (uint8_t *)nl;
      if (bVar1) {
        pcVar4 = "";
        puVar3 = "";
      }
      bVar1 = false;
      printf("%s%s%*s\"%s\"",pcVar4,puVar3,(ulong)indent,"",pcVar2);
    }
    bit_index_00 = bit_index_00 + 1;
  } while (bit_index_00 != 0x20);
  if (!bVar1) {
    printf("%s",nl);
    return;
  }
  return;
}

Assistant:

static void printFlagBitsJSON(uint32_t indent, const char* nl, uint32_t flags, const char*(*toStringFn)(uint32_t, bool)) {
    bool first = true;
    for (uint32_t bit_index = 0; bit_index < 32; ++bit_index) {
        uint32_t bit_mask = 1u << bit_index;
        bool bit_value = (bit_mask & (uint32_t) flags) != 0;

        const char* str = toStringFn(bit_index, bit_value);
        if (str) {
            printf("%s%s%*s\"%s\"", first ? "" : ",", first ? "" : nl, indent, "", str);
            first = false;
        } else if (bit_value) {
            printf("%s%s%*s%u", first ? "" : ",", first ? "" : nl, indent, "", bit_mask);
            first = false;
        }
    }
    if (!first)
        printf("%s", nl);
}